

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

void __thiscall icu_63::AndConstraint::AndConstraint(AndConstraint *this,AndConstraint *other)

{
  UErrorCode *status;
  UErrorCode UVar1;
  UVector32 *this_00;
  AndConstraint *pAVar2;
  
  this->_vptr_AndConstraint = (_func_int **)&PTR__AndConstraint_0047bf78;
  this->op = NONE;
  this->opNum = -1;
  this->value = -1;
  this->rangeList = (UVector32 *)0x0;
  this->negated = '\0';
  this->integerOnly = '\0';
  *(undefined8 *)&this->digitsType = 0;
  *(undefined8 *)((long)&this->next + 4) = 0;
  UVar1 = other->fInternalStatus;
  this->fInternalStatus = UVar1;
  if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
    status = &this->fInternalStatus;
    this->op = other->op;
    this->opNum = other->opNum;
    this->value = other->value;
    pAVar2 = other;
    if (other->rangeList != (UVector32 *)0x0) {
      this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)other);
      if (this_00 == (UVector32 *)0x0) {
        this_00 = (UVector32 *)0x0;
      }
      else {
        pAVar2 = (AndConstraint *)status;
        UVector32::UVector32(this_00,status);
      }
      if ((this_00 == (UVector32 *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      UVar1 = *status;
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
        this->rangeList = this_00;
        pAVar2 = (AndConstraint *)other->rangeList;
        UVector32::assign(this_00,(UVector32 *)pAVar2,status);
        this_00 = (UVector32 *)0x0;
      }
      if (this_00 != (UVector32 *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      }
      if (U_ZERO_ERROR < UVar1) {
        return;
      }
    }
    this->integerOnly = other->integerOnly;
    this->negated = other->negated;
    this->digitsType = other->digitsType;
    if (other->next != (AndConstraint *)0x0) {
      pAVar2 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)pAVar2);
      if (pAVar2 == (AndConstraint *)0x0) {
        pAVar2 = (AndConstraint *)0x0;
      }
      else {
        AndConstraint(pAVar2,other->next);
      }
      this->next = pAVar2;
      if (pAVar2 == (AndConstraint *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
  }
  return;
}

Assistant:

AndConstraint::AndConstraint(const AndConstraint& other) {
    this->fInternalStatus = other.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid.
    }
    this->op = other.op;
    this->opNum=other.opNum;
    this->value=other.value;
    if (other.rangeList != nullptr) {
        LocalPointer<UVector32> newRangeList(new UVector32(fInternalStatus), fInternalStatus);
        if (U_FAILURE(fInternalStatus)) {
            return;
        }
        this->rangeList = newRangeList.orphan();
        this->rangeList->assign(*other.rangeList, fInternalStatus);
    }
    this->integerOnly=other.integerOnly;
    this->negated=other.negated;
    this->digitsType = other.digitsType;
    if (other.next != nullptr) {
        this->next = new AndConstraint(*other.next);
        if (this->next == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
    }
}